

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_aec.c
# Opt level: O0

int encode_decode_small(test_state *state)

{
  aec_stream_conflict *strm_00;
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  uint local_58;
  int local_54;
  int i_2;
  int i_1;
  int i;
  int status;
  aec_stream *strm;
  size_t total_out;
  size_t avail_out;
  size_t avail_in;
  size_t n_in;
  size_t compressed_size;
  test_state *state_local;
  
  strm_00 = (aec_stream_conflict *)state->strm;
  iVar4 = aec_encode_init((aec_stream *)strm_00);
  if (iVar4 != 0) {
    printf("Init failed.\n");
    return 99;
  }
  avail_in = 0;
  bVar3 = true;
  bVar2 = true;
  strm = (aec_stream *)0x0;
  strm_00->next_in = state->ubuf;
  strm_00->avail_in = (long)state->bytes_per_sample;
  strm_00->avail_out = 1;
  strm_00->next_out = state->cbuf;
  while( true ) {
    if ((bVar3) || (bVar5 = false, bVar2)) {
      bVar5 = strm < (aec_stream *)state->cbuf_len;
    }
    if (!bVar5) break;
    if ((strm_00->avail_in == 0) && (bVar3)) {
      avail_in = (long)state->bytes_per_sample + avail_in;
      if (avail_in < state->buf_len) {
        strm_00->avail_in = (long)state->bytes_per_sample;
        strm_00->next_in = state->ubuf + avail_in;
      }
      else {
        bVar3 = false;
      }
    }
    iVar4 = aec_encode((aec_stream *)strm_00,0);
    if (iVar4 != 0) {
      printf("Decode failed.\n");
      return 99;
    }
    if (((aec_stream *)strm_00->total_out == strm) || ((aec_stream *)state->cbuf_len <= strm)) {
      bVar2 = false;
    }
    else {
      strm = (aec_stream *)strm_00->total_out;
      strm_00->avail_out = 1;
      strm_00->next_out = state->cbuf + (long)strm;
      bVar2 = true;
    }
  }
  iVar4 = aec_encode((aec_stream *)strm_00,1);
  if (iVar4 != 0) {
    printf("Encode failed.\n");
    return 99;
  }
  aec_encode_end((aec_stream *)strm_00);
  uVar1 = strm_00->total_out;
  strm_00->avail_in = 1;
  strm_00->next_in = state->cbuf;
  strm_00->avail_out = (long)state->bytes_per_sample;
  strm_00->next_out = state->obuf;
  iVar4 = aec_decode_init(strm_00);
  if (iVar4 != 0) {
    printf("Init failed.\n");
    return 99;
  }
  avail_in = 0;
  bVar3 = true;
  bVar2 = true;
  strm = (aec_stream *)0x0;
  strm_00->next_in = state->cbuf;
  strm_00->avail_in = 1;
  strm_00->avail_out = (long)state->bytes_per_sample;
  strm_00->next_out = state->obuf;
  while( true ) {
    if ((bVar3) || (bVar5 = false, bVar2)) {
      bVar5 = strm < (aec_stream *)state->buf_len;
    }
    if (!bVar5) break;
    if ((strm_00->avail_in == 0) && (bVar3)) {
      avail_in = avail_in + 1;
      if (avail_in < uVar1) {
        strm_00->avail_in = 1;
        strm_00->next_in = state->cbuf + avail_in;
      }
      else {
        bVar3 = false;
      }
    }
    iVar4 = aec_decode(strm_00,0);
    if (iVar4 != 0) {
      printf("Decode failed.\n");
      return 99;
    }
    if (((aec_stream *)strm_00->total_out == strm) || ((aec_stream *)state->buf_len <= strm)) {
      bVar2 = false;
    }
    else {
      strm = (aec_stream *)strm_00->total_out;
      strm_00->avail_out = (long)state->bytes_per_sample;
      strm_00->next_out = state->obuf + (long)strm;
      bVar2 = true;
    }
  }
  iVar4 = aec_decode(strm_00,1);
  if (iVar4 != 0) {
    printf("Decode failed.\n");
    return 99;
  }
  iVar4 = memcmp(state->ubuf,state->obuf,state->ibuf_len);
  if (iVar4 != 0) {
    printf("\n%s: Uncompressed output differs from input.\n","\x1b[0;31mFAIL\x1b[0m");
    printf("\nuncompressed buf");
    for (i_2 = 0; i_2 < 0x50; i_2 = i_2 + 1) {
      if (i_2 % 8 == 0) {
        printf("\n");
      }
      printf("%02x ",(ulong)state->ubuf[i_2]);
    }
    printf("\n\ncompressed buf len %zu",uVar1);
    for (local_54 = 0; local_54 < 0x50; local_54 = local_54 + 1) {
      if (local_54 % 8 == 0) {
        printf("\n");
      }
      printf("%02x ",(ulong)state->cbuf[local_54]);
    }
    printf("\n\ndecompressed buf");
    for (local_58 = 0; (int)local_58 < 0x50; local_58 = local_58 + 1) {
      if ((int)local_58 % 8 == 0) {
        printf("\n%04i ",(ulong)local_58);
      }
      printf("%02x ",(ulong)state->obuf[(int)local_58]);
    }
    printf("\n");
    return 99;
  }
  aec_decode_end(strm_00);
  return 0;
}

Assistant:

int encode_decode_small(struct test_state *state)
{
    size_t compressed_size;
    size_t n_in, avail_in, avail_out, total_out;
    struct aec_stream *strm = state->strm;

    int status = aec_encode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->ubuf;
    strm->avail_in = state->bytes_per_sample;
    strm->avail_out = 1;
    strm->next_out = state->cbuf;

    while ((avail_in || avail_out) && total_out < state->cbuf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in += state->bytes_per_sample;
            if (n_in < state->buf_len) {
                strm->avail_in = state->bytes_per_sample;
                strm->next_in = state->ubuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_encode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->cbuf_len) {
            total_out = strm->total_out;
            strm->avail_out = 1;
            strm->next_out = state->cbuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_encode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Encode failed.\n");
        return 99;
    }

    aec_encode_end(strm);

    compressed_size = strm->total_out;

    strm->avail_in = 1;
    strm->next_in = state->cbuf;

    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    status = aec_decode_init(strm);
    if (status != AEC_OK) {
        printf("Init failed.\n");
        return 99;
    }

    n_in = 0;
    avail_in = 1;
    avail_out = 1;
    total_out = 0;
    strm->next_in = state->cbuf;
    strm->avail_in = 1;
    strm->avail_out = state->bytes_per_sample;
    strm->next_out = state->obuf;

    while ((avail_in || avail_out) && total_out < state->buf_len) {
        if (strm->avail_in == 0 && avail_in) {
            n_in++;
            if (n_in < compressed_size) {
                strm->avail_in = 1;
                strm->next_in = state->cbuf + n_in;
            } else {
                avail_in = 0;
            }
        }

        status = aec_decode(strm, AEC_NO_FLUSH);
        if (status != AEC_OK) {
            printf("Decode failed.\n");
            return 99;
        }

        if (strm->total_out - total_out > 0
            && total_out < state->buf_len) {
            total_out = strm->total_out;
            strm->avail_out = state->bytes_per_sample;
            strm->next_out = state->obuf + total_out;
            avail_out = 1;
        } else {
            avail_out = 0;
        }
    }

    status = aec_decode(strm, AEC_FLUSH);
    if (status != AEC_OK) {
        printf("Decode failed.\n");
        return 99;
    }

    if (memcmp(state->ubuf, state->obuf, state->ibuf_len)) {
        printf("\n%s: Uncompressed output differs from input.\n", CHECK_FAIL);

        printf("\nuncompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->ubuf[i]);
        }
        printf("\n\ncompressed buf len %zu", compressed_size);
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n");
            printf("%02x ", state->cbuf[i]);
        }
        printf("\n\ndecompressed buf");
        for (int i = 0; i < 80; i++) {
            if (i % 8 == 0)
                printf("\n%04i ", i);
            printf("%02x ", state->obuf[i]);
        }
        printf("\n");
        return 99;
    }
    aec_decode_end(strm);
    return 0;
}